

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O0

void note_notify_child(nsync_note n,nsync_note parent)

{
  void *pvVar1;
  nsync_note n_00;
  nsync_time a;
  uint32_t uVar2;
  int iVar3;
  nsync_dll_element_ *e;
  nsync_dll_list_ pnVar4;
  nsync_note child;
  nsync_waiter_s *nw;
  nsync_dll_element_ *next;
  nsync_dll_element_ *p;
  nsync_time t;
  nsync_note parent_local;
  nsync_note n_local;
  
  uVar2 = atm_load_acq_u32_(&n->notified);
  if (uVar2 == 0) {
    if (n->expiry_time_valid == 0) {
      p = (nsync_dll_element_ *)0x7fffffffffffffff;
      t.tv_sec = 999999999;
    }
    else {
      p = (nsync_dll_element_ *)(n->expiry_time).tv_sec;
      t.tv_sec = (n->expiry_time).tv_nsec;
    }
  }
  else {
    p = (nsync_dll_element_ *)0;
    t.tv_sec = 0;
  }
  a.tv_nsec = t.tv_sec;
  a.tv_sec = (__time_t)p;
  iVar3 = nsync_time_cmp(a,(nsync_time)ZEXT816((ulong)0));
  if (0 < iVar3) {
    n->notified = 1;
    while (e = nsync_dll_first_(n->waiters), e != (nsync_dll_element_ *)0x0) {
      pvVar1 = e->container;
      pnVar4 = nsync_dll_remove_(n->waiters,e);
      n->waiters = pnVar4;
      *(undefined4 *)((long)pvVar1 + 0x20) = 0;
      nsync_mu_semaphore_v(*(nsync_semaphore **)((long)pvVar1 + 0x28));
    }
    next = nsync_dll_first_(n->children);
    while (next != (nsync_dll_element_ *)0x0) {
      n_00 = (nsync_note)next->container;
      next = nsync_dll_next_(n->children,next);
      nsync_mu_lock(&n_00->note_mu);
      if (n_00->disconnecting == 0) {
        note_notify_child(n_00,n);
      }
      nsync_mu_unlock(&n_00->note_mu);
    }
    nsync_mu_wait(&n->note_mu,no_children,n,(_func_int_void_ptr_void_ptr *)0x0);
    if (parent != (nsync_note)0x0) {
      pnVar4 = nsync_dll_remove_(parent->children,&n->parent_child_link);
      parent->children = pnVar4;
      n->parent = (nsync_note_s_ *)0x0;
    }
  }
  return;
}

Assistant:

static void note_notify_child (nsync_note n, nsync_note parent) {
	nsync_time t;
	t = NOTIFIED_TIME (n);
	if (nsync_time_cmp (t, nsync_time_zero) > 0) {
		nsync_dll_element_ *p;
		nsync_dll_element_ *next;
		ATM_STORE_REL (&n->notified, 1);
		while ((p = nsync_dll_first_ (n->waiters)) != NULL) {
			struct nsync_waiter_s *nw = DLL_NSYNC_WAITER (p);
			n->waiters = nsync_dll_remove_ (n->waiters, p);
			ATM_STORE_REL (&nw->waiting, 0);
			nsync_mu_semaphore_v (nw->sem);
		}
		for (p = nsync_dll_first_ (n->children); p != NULL; p = next) {
			nsync_note child = DLL_NOTE (p);
			next = nsync_dll_next_ (n->children, p);
			nsync_mu_lock (&child->note_mu);
			if (child->disconnecting == 0) {
				note_notify_child (child, n);
			}
			nsync_mu_unlock (&child->note_mu);
		}
		WAIT_FOR_NO_CHILDREN (no_children, n);
		if (parent != NULL) {
			parent->children = nsync_dll_remove_ (parent->children,
						              &n->parent_child_link);
			WAKEUP_NO_CHILDREN (parent);
			n->parent = NULL;
		}
	}
}